

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O0

int32_t icu_63::DayPeriodRulesDataSink::parseHour(UnicodeString *time,UErrorCode *errorCode)

{
  UBool UVar1;
  char16_t cVar2;
  int32_t iVar3;
  int iVar4;
  int local_28;
  int32_t hourDigit2;
  int32_t hour;
  int32_t hourLimit;
  UErrorCode *errorCode_local;
  UnicodeString *time_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    iVar3 = icu_63::UnicodeString::length(time);
    iVar4 = iVar3 + -3;
    if ((((iVar4 == 1) || (iVar4 == 2)) &&
        (cVar2 = icu_63::UnicodeString::operator[](time,iVar4), cVar2 == L':')) &&
       ((cVar2 = icu_63::UnicodeString::operator[](time,iVar3 + -2), cVar2 == L'0' &&
        (cVar2 = icu_63::UnicodeString::operator[](time,iVar3 + -1), cVar2 == L'0')))) {
      cVar2 = icu_63::UnicodeString::operator[](time,0);
      local_28 = (ushort)cVar2 - 0x30;
      if ((local_28 < 0) || (9 < local_28)) {
        *errorCode = U_INVALID_FORMAT_ERROR;
        time_local._4_4_ = 0;
      }
      else {
        if (iVar4 == 2) {
          cVar2 = icu_63::UnicodeString::operator[](time,1);
          iVar4 = (ushort)cVar2 - 0x30;
          if ((iVar4 < 0) || (9 < iVar4)) {
            *errorCode = U_INVALID_FORMAT_ERROR;
            return 0;
          }
          local_28 = local_28 * 10 + iVar4;
          if (0x18 < local_28) {
            *errorCode = U_INVALID_FORMAT_ERROR;
            return 0;
          }
        }
        time_local._4_4_ = local_28;
      }
    }
    else {
      *errorCode = U_INVALID_FORMAT_ERROR;
      time_local._4_4_ = 0;
    }
  }
  else {
    time_local._4_4_ = 0;
  }
  return time_local._4_4_;
}

Assistant:

static int32_t parseHour(const UnicodeString &time, UErrorCode &errorCode) {
        if (U_FAILURE(errorCode)) {
            return 0;
        }

        int32_t hourLimit = time.length() - 3;
        // `time` must look like "x:00" or "xx:00".
        // If length is wrong or `time` doesn't end with ":00", error out.
        if ((hourLimit != 1 && hourLimit != 2) ||
                time[hourLimit] != 0x3A || time[hourLimit + 1] != 0x30 ||
                time[hourLimit + 2] != 0x30) {
            errorCode = U_INVALID_FORMAT_ERROR;
            return 0;
        }

        // If `time` doesn't begin with a number in [0, 24], error out.
        // Note: "24:00" is possible in "before 24:00".
        int32_t hour = time[0] - 0x30;
        if (hour < 0 || 9 < hour) {
            errorCode = U_INVALID_FORMAT_ERROR;
            return 0;
        }
        if (hourLimit == 2) {
            int32_t hourDigit2 = time[1] - 0x30;
            if (hourDigit2 < 0 || 9 < hourDigit2) {
                errorCode = U_INVALID_FORMAT_ERROR;
                return 0;
            }
            hour = hour * 10 + hourDigit2;
            if (hour > 24) {
                errorCode = U_INVALID_FORMAT_ERROR;
                return 0;
            }
        }

        return hour;
    }